

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O2

Token * has_token_of_type(List *list,TokenType type)

{
  Token *pTVar1;
  
  while( true ) {
    if (list == (List *)0x0) {
      return (Token *)0x0;
    }
    if ((list->token).type == type) break;
    pTVar1 = has_token_of_type(list->car,type);
    if (pTVar1 != (Token *)0x0) {
      return pTVar1;
    }
    list = list->cdr;
  }
  return &list->token;
}

Assistant:

Token *
has_token_of_type (List *list, TokenType type)
{
  Token *t;

  if (list == NULL)
    return NULL;
  if (list->token.type == type)
    return &list->token;
  t = has_token_of_type (list->car, type);
  if (t != NULL)
    return t;
  t = has_token_of_type (list->cdr, type);
  if (t != NULL)
    return t;
  return NULL;
}